

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

FilterInfo * __thiscall helics::FilterFederate::getFilterInfo(FilterFederate *this,GlobalHandle id)

{
  FilterInfo *pFVar1;
  GlobalHandle *unaff_retaddr;
  
  pFVar1 = gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::find
                     ((MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *)this,
                      unaff_retaddr);
  return pFVar1;
}

Assistant:

FilterInfo* FilterFederate::getFilterInfo(GlobalHandle id)
{
    return filters.find(id);
}